

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

LoopContinueLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_loopcontinue(NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  LoopContinueLayerParams *pLVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_loopcontinue(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_loopcontinue(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pLVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::LoopContinueLayerParams>(arena);
    (this->layer_).loopcontinue_ = pLVar2;
  }
  return (LoopContinueLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::LoopContinueLayerParams* NeuralNetworkLayer::_internal_mutable_loopcontinue() {
  if (!_internal_has_loopcontinue()) {
    clear_layer();
    set_has_loopcontinue();
    layer_.loopcontinue_ = CreateMaybeMessage< ::CoreML::Specification::LoopContinueLayerParams >(GetArenaForAllocation());
  }
  return layer_.loopcontinue_;
}